

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O3

void __thiscall AFastProjectile::Tick(AFastProjectile *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  sector_t *psVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  AActor *target;
  bool bVar10;
  ulong uVar11;
  line_t *line;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  DVector3 local_f8;
  double local_d8;
  double dStack_d0;
  FCheckPosition local_c8;
  
  (this->super_AActor).Prev.Z = (this->super_AActor).__Pos.Z;
  dVar2 = (this->super_AActor).__Pos.Y;
  (this->super_AActor).Prev.X = (this->super_AActor).__Pos.X;
  (this->super_AActor).Prev.Y = dVar2;
  (this->super_AActor).PrevAngles.Roll.Degrees = (this->super_AActor).Angles.Roll.Degrees;
  dVar2 = (this->super_AActor).Angles.Yaw.Degrees;
  (this->super_AActor).PrevAngles.Pitch.Degrees = (this->super_AActor).Angles.Pitch.Degrees;
  (this->super_AActor).PrevAngles.Yaw.Degrees = dVar2;
  psVar4 = (this->super_AActor).Sector;
  if (psVar4 == (sector_t *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = psVar4->PortalGroup;
  }
  (this->super_AActor).PrevPortalGroup = iVar9;
  if (((this->super_AActor).flags5.Value & 0x400000) == 0) {
    if ((bglobal._16_1_ & 1) != 0) {
      return;
    }
    if (((byte)level.flags2 & 0x20) != 0) {
      return;
    }
  }
  bVar10 = (bool)(*(byte *)((long)&(this->super_AActor).flags2.Value + 1) & 1);
  local_c8.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_c8.LastRipped,1);
  local_c8.PushTime = 0;
  local_c8.FromPMove = false;
  dVar2 = (this->super_AActor).radius;
  if (dVar2 <= 0.0) {
    dVar14 = (this->super_AActor).Vel.X;
    dVar15 = (this->super_AActor).Vel.Y;
    uVar12 = 8;
  }
  else {
    dVar14 = (this->super_AActor).Vel.X;
    dVar15 = (this->super_AActor).Vel.Y;
    uVar8 = 8;
    do {
      do {
        uVar12 = (ulong)uVar8;
        dVar13 = (double)(int)uVar8 * dVar2;
        uVar8 = uVar8 * 2;
      } while (dVar13 < ABS(dVar14));
    } while (dVar13 < ABS(dVar15));
  }
  dVar2 = (this->super_AActor).Vel.Z;
  local_c8.DoRipping = bVar10;
  if (((((dVar14 == 0.0) && (!NAN(dVar14))) && (dVar15 == 0.0)) &&
      ((!NAN(dVar15) && (dVar2 == 0.0)))) && (!NAN(dVar2))) {
    dVar13 = (this->super_AActor).__Pos.Z;
    pdVar1 = &(this->super_AActor).floorz;
    if ((dVar13 == *pdVar1) && (!NAN(dVar13) && !NAN(*pdVar1))) goto LAB_0060b289;
  }
  if (0 < (int)uVar12) {
    dVar13 = 1.0 / (double)(int)uVar12;
    local_d8 = dVar14 * dVar13;
    dStack_d0 = dVar15 * dVar13;
    bVar10 = local_d8 != 0.0;
    bVar5 = dStack_d0 != 0.0;
    uVar6 = uVar12 >> 3;
    uVar11 = uVar6;
    do {
      if (bVar5 || bVar10) {
        if ((int)uVar11 < 2) {
          M_Free(local_c8.LastRipped.Nodes);
          local_c8.LastRipped.Nodes = (Node *)0x0;
          local_c8.LastRipped.LastFree = (Node *)0x0;
          local_c8.LastRipped.Size = 0;
          local_c8.LastRipped.NumUsed = 0;
          TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
                    (&local_c8.LastRipped,1);
        }
        dVar14 = (this->super_AActor).__Pos.Y + dStack_d0;
        local_f8.Y._0_4_ = SUB84(dVar14,0);
        local_f8.X = (this->super_AActor).__Pos.X + local_d8;
        local_f8.Y._4_4_ = (int)((ulong)dVar14 >> 0x20);
        bVar7 = P_TryMove(&this->super_AActor,(DVector2 *)&local_f8,1,(secplane_t *)0x0,&local_c8,
                          false);
        if (bVar7) {
          uVar11 = (ulong)((int)uVar11 - 1);
          goto LAB_0060b20a;
        }
        if (((this->super_AActor).flags3.Value & 0x4000) == 0) {
          if (((local_c8.ceilingline == (line_t *)0x0) ||
              (psVar4 = (local_c8.ceilingline)->backsector, psVar4 == (sector_t *)0x0)) ||
             (psVar4->planes[1].Texture.texnum != skyflatnum.texnum)) {
LAB_0060b3ce:
            line = (this->super_AActor).BlockingLine;
            if (line == (line_t *)0x0) {
              line = (line_t *)0x0;
            }
            else if (line->special == 9) goto LAB_0060b3e0;
            goto LAB_0060b3f6;
          }
          dVar2 = (this->super_AActor).__Pos.Z;
          AActor::PosRelative(&local_f8,&this->super_AActor,local_c8.ceilingline);
          if (dVar2 < ((psVar4->ceilingplane).normal.Y * local_f8.Y +
                      (psVar4->ceilingplane).D + (psVar4->ceilingplane).normal.X * local_f8.X) *
                      (psVar4->ceilingplane).negiC) goto LAB_0060b3ce;
          goto LAB_0060b3e0;
        }
        line = (this->super_AActor).BlockingLine;
LAB_0060b3f6:
        target = (this->super_AActor).BlockingMobj;
LAB_0060b3fd:
        P_ExplodeMissile(&this->super_AActor,line,target);
        goto LAB_0060b405;
      }
LAB_0060b20a:
      (this->super_AActor).__Pos.Z = (this->super_AActor).__Pos.Z + dVar13 * dVar2;
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x24])(this);
      dVar14 = (this->super_AActor).__Pos.Z;
      dVar15 = (this->super_AActor).floorz;
      if (dVar14 <= dVar15) {
        if (((this->super_AActor).floorpic.texnum != skyflatnum.texnum) ||
           (((this->super_AActor).flags3.Value & 0x4000) != 0)) {
          (this->super_AActor).__Pos.Z = dVar15;
          P_HitFloor(&this->super_AActor);
LAB_0060b340:
          line = (line_t *)0x0;
          target = (AActor *)0x0;
          goto LAB_0060b3fd;
        }
LAB_0060b3e0:
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
        goto LAB_0060b405;
      }
      dVar15 = (this->super_AActor).ceilingz;
      dVar3 = (this->super_AActor).Height;
      if (dVar15 < dVar14 + dVar3) {
        if (((this->super_AActor).ceilingpic.texnum == skyflatnum.texnum) &&
           (((this->super_AActor).flags3.Value & 0x4000) == 0)) goto LAB_0060b3e0;
        (this->super_AActor).__Pos.Z = dVar15 - dVar3;
        goto LAB_0060b340;
      }
      if ((int)uVar11 < 1 && (bVar5 || bVar10)) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])(this);
        uVar11 = uVar6;
      }
      uVar8 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
LAB_0060b289:
  bVar10 = AActor::CheckNoDelay(&this->super_AActor);
  if ((bVar10) && (iVar9 = (this->super_AActor).tics, iVar9 != -1)) {
    if (0 < iVar9) {
      iVar9 = iVar9 + -1;
      (this->super_AActor).tics = iVar9;
    }
    if (iVar9 == 0) {
      do {
        bVar10 = AActor::SetState(&this->super_AActor,((this->super_AActor).state)->NextState,false)
        ;
      } while (bVar10 && (this->super_AActor).tics == 0);
    }
  }
LAB_0060b405:
  M_Free(local_c8.LastRipped.Nodes);
  return;
}

Assistant:

void AFastProjectile::Tick ()
{
	int i;
	DVector3 frac;
	int changexy;

	ClearInterpolation();
	double oldz = Z();

	if (!(flags5 & MF5_NOTIMEFREEZE))
	{
		//Added by MC: Freeze mode.
		if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
		{
			return;
		}
	}


	// [RH] Ripping is a little different than it was in Hexen
	FCheckPosition tm(!!(flags2 & MF2_RIP));

	int count = 8;
	if (radius > 0)
	{
		while ( fabs(Vel.X) > radius * count || fabs(Vel.Y) > radius * count)
		{
			// we need to take smaller steps.
			count += count;
		}
	}

	// Handle movement
	if (!Vel.isZero() || (Z() != floorz))
	{
		frac = Vel / count;
		changexy = frac.X != 0 || frac.Y != 0;
		int ripcount = count / 8;
		for (i = 0; i < count; i++)
		{
			if (changexy)
			{
				if (--ripcount <= 0)
				{
					tm.LastRipped.Clear();	// [RH] Do rip damage each step, like Hexen
				}
				
				if (!P_TryMove (this, Pos() + frac, true, NULL, tm))
				{ // Blocked move
					if (!(flags3 & MF3_SKYEXPLODE))
					{
						if (tm.ceilingline &&
							tm.ceilingline->backsector &&
							tm.ceilingline->backsector->GetTexture(sector_t::ceiling) == skyflatnum &&
							Z() >= tm.ceilingline->backsector->ceilingplane.ZatPoint(PosRelative(tm.ceilingline)))
						{
							// Hack to prevent missiles exploding against the sky.
							// Does not handle sky floors.
							Destroy ();
							return;
						}
						// [RH] Don't explode on horizon lines.
						if (BlockingLine != NULL && BlockingLine->special == Line_Horizon)
						{
							Destroy ();
							return;
						}
					}

					P_ExplodeMissile (this, BlockingLine, BlockingMobj);
					return;
				}
			}
			AddZ(frac.Z);
			UpdateWaterLevel ();
			oldz = Z();
			if (oldz <= floorz)
			{ // Hit the floor

				if (floorpic == skyflatnum && !(flags3 & MF3_SKYEXPLODE))
				{
					// [RH] Just remove the missile without exploding it
					//		if this is a sky floor.
					Destroy ();
					return;
				}

				SetZ(floorz);
				P_HitFloor (this);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (Top() > ceilingz)
			{ // Hit the ceiling

				if (ceilingpic == skyflatnum &&  !(flags3 & MF3_SKYEXPLODE))
				{
					Destroy ();
					return;
				}

				SetZ(ceilingz - Height);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (changexy && ripcount <= 0) 
			{
				ripcount = count >> 3;
				Effect();
			}
		}
	}
	if (!CheckNoDelay())
		return;		// freed itself
	// Advance the state
	if (tics != -1)
	{
		if (tics > 0) tics--;
		while (!tics)
		{
			if (!SetState (state->GetNextState ()))
			{ // mobj was removed
				return;
			}
		}
	}
}